

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_protocol_options.cpp
# Opt level: O3

string * __thiscall
bidfx_public_api::price::pixie::PixieProtocolOptions::GetProtocolSignature_abi_cxx11_
          (string *__return_storage_ptr__,PixieProtocolOptions *this)

{
  ostream *poVar1;
  stringstream signature;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"pixie://localhost?version=",0x1a);
  poVar1 = (ostream *)std::ostream::operator<<(local_198,this->version_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"&heartbeat=",0xb);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"&idle=",6);
  std::ostream::_M_insert<long>((long)poVar1);
  if (this->minti_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"&minti=",7);
    std::ostream::operator<<(local_198,this->minti_);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string PixieProtocolOptions::GetProtocolSignature() const
{
    std::stringstream signature;
    signature << "pixie://localhost?version=" << version_ << "&heartbeat=" << heartbeat_interval_.count() / 1000 << "&idle=" << idle_.count() / 1000;

    if (minti_ != 0)
    {
        signature << "&minti=" << minti_;
    }

    std::string ret = signature.str();

    return ret;
}